

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

bool __thiscall
BaseNode::IsAlreadyConnectedWithPendingConnection
          (BaseNode *this,char *current_slot_title,int current_slot_kind)

{
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  iterator __begin3;
  pointer pCVar4;
  iterator __end3;
  int other_slot_kind;
  char *other_slot_title;
  void *other_node_id;
  uint local_44;
  char *local_40;
  void *local_38;
  
  bVar2 = ImNodes::GetPendingConnection(&local_38,&local_40,(int *)&local_44);
  if (bVar2) {
    if (-1 < (int)(current_slot_kind ^ local_44)) {
      __assert_fail("ImNodes::IsInputSlotKind(current_slot_kind) != ImNodes::IsInputSlotKind(other_slot_kind)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/nodes.cpp"
                    ,0x12a,
                    "bool BaseNode::IsAlreadyConnectedWithPendingConnection(const char *, int)");
    }
    pCVar4 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
             .super__Vector_impl_data._M_start;
    pCVar1 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((int)local_44 < 0) {
      for (; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
        if ((((pCVar4->input_node == local_38) &&
             (iVar3 = strcmp(pCVar4->input_slot,local_40), iVar3 == 0)) &&
            ((BaseNode *)pCVar4->output_node == this)) &&
           (iVar3 = strcmp(pCVar4->output_slot,current_slot_title), iVar3 == 0)) {
          return true;
        }
      }
    }
    else {
      for (; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
        if ((((BaseNode *)pCVar4->input_node == this) &&
            (iVar3 = strcmp(pCVar4->input_slot,current_slot_title), iVar3 == 0)) &&
           ((pCVar4->output_node == local_38 &&
            (iVar3 = strcmp(pCVar4->output_slot,local_40), iVar3 == 0)))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsAlreadyConnectedWithPendingConnection(const char* current_slot_title, int current_slot_kind)
    {
        void* other_node_id;
        const char* other_slot_title;
        int other_slot_kind;
        if (ImNodes::GetPendingConnection(&other_node_id, &other_slot_title, &other_slot_kind))
        {
            assert(ImNodes::IsInputSlotKind(current_slot_kind) != ImNodes::IsInputSlotKind(other_slot_kind));

            if (ImNodes::IsInputSlotKind(other_slot_kind))
            {
                for (const auto& conn : connections)
                {
                    if (conn.input_node == other_node_id && strcmp(conn.input_slot, other_slot_title) == 0 &&
                        conn.output_node == this && strcmp(conn.output_slot, current_slot_title) == 0)
                        return true;
                }
            }
            else
            {
                for (const auto& conn : connections)
                {
                    if (conn.input_node == this && strcmp(conn.input_slot, current_slot_title) == 0 &&
                        conn.output_node == other_node_id && strcmp(conn.output_slot, other_slot_title) == 0)
                        return true;
                }
            }
        }
        return false;
    }